

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTargetInternals::AddPathToFileSet<cmValue>
          (cmTargetInternals *this,cmTarget *self,string *fileSetName,cmValue value,
          string_view fileSetType,string_view description,bool clear)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  int iVar4;
  iterator iVar5;
  _Base_ptr __n;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  string local_d8;
  string *local_b8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  size_type local_70;
  char *local_68;
  undefined8 local_60;
  char *local_58;
  _Base_ptr local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  
  __n = (_Base_ptr)fileSetType._M_len;
  local_b8 = value.Value;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>_>
          ::find(&(((self->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->FileSets)._M_t
                 ,fileSetName);
  if (iVar5._M_node ==
      (_Base_ptr)
      ((long)&((self->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->FileSets + 8U)) {
    pcVar2 = this->Makefile;
    local_80._M_len = description._M_len;
    local_80._M_str = description._M_str;
    local_70 = 0x19;
    local_68 = "has not yet been created.";
    views_00._M_len = 2;
    views_00._M_array = &local_80;
    cmCatViews_abi_cxx11_(&local_d8,views_00);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_d8);
  }
  else {
    if ((iVar5._M_node[3]._M_parent == __n) &&
       ((__n == (_Base_ptr)0x0 ||
        (iVar4 = bcmp(*(void **)(iVar5._M_node + 3),fileSetType._M_str,(size_t)__n), iVar4 == 0))))
    {
      if (clear) {
        cmFileSet::ClearFileEntries((cmFileSet *)(iVar5._M_node + 2));
      }
      if (local_b8 == (string *)0x0) {
        return;
      }
      if (local_b8->_M_string_length == 0) {
        return;
      }
      pcVar3 = (local_b8->_M_dataplus)._M_p;
      local_108 = &local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar3,pcVar3 + local_b8->_M_string_length);
      cmMakefile::GetBacktrace(this->Makefile);
      paVar1 = &local_b0.Value.field_2;
      if (local_108 == &local_f8) {
        local_b0.Value.field_2._8_8_ = local_f8._8_8_;
        local_b0.Value._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b0.Value._M_dataplus._M_p = (pointer)local_108;
      }
      local_b0.Value.field_2._M_allocated_capacity._1_7_ = local_f8._M_allocated_capacity._1_7_;
      local_b0.Value.field_2._M_local_buf[0] = local_f8._M_local_buf[0];
      local_b0.Value._M_string_length = local_100;
      local_100 = 0;
      local_f8._M_local_buf[0] = '\0';
      local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_e8;
      local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Stack_e0;
      local_e8 = (element_type *)0x0;
      p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_108 = &local_f8;
      cmFileSet::AddFileEntry((cmFileSet *)(iVar5._M_node + 2),&local_b0);
      if (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.Value._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0.Value._M_dataplus._M_p,
                        local_b0.Value.field_2._M_allocated_capacity + 1);
      }
      if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
      }
      if (local_108 == &local_f8) {
        return;
      }
      local_d8.field_2._M_allocated_capacity =
           CONCAT71(local_f8._M_allocated_capacity._1_7_,local_f8._M_local_buf[0]);
      local_d8._M_dataplus._M_p = (pointer)local_108;
      goto LAB_002fa63b;
    }
    pcVar2 = this->Makefile;
    local_68 = (fileSetName->_M_dataplus)._M_p;
    local_70 = fileSetName->_M_string_length;
    local_80._M_len = 10;
    local_80._M_str = "File set \"";
    local_60 = 0x12;
    local_58 = "\" is not of type \"";
    local_40 = 2;
    local_38 = "\".";
    views._M_len = 5;
    views._M_array = &local_80;
    local_50 = __n;
    local_48 = fileSetType._M_str;
    cmCatViews_abi_cxx11_(&local_d8,views);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
    return;
  }
LAB_002fa63b:
  operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void cmTargetInternals::AddPathToFileSet(
  cmTarget* self, std::string const& fileSetName, ValueType value,
  cm::string_view fileSetType, cm::string_view description, bool clear)
{
  auto* fileSet = self->GetFileSet(fileSetName);
  if (!fileSet) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(description, "has not yet been created."));
    return;
  }
  if (fileSet->GetType() != fileSetType) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat("File set \"", fileSetName,
                                          "\" is not of type \"", fileSetType,
                                          "\"."));
    return;
  }
  if (clear) {
    fileSet->ClearFileEntries();
  }
  if (!StringIsEmpty(value)) {
    fileSet->AddFileEntry(
      BT<std::string>(value, this->Makefile->GetBacktrace()));
  }
}